

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool tinyexr::miniz::tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  ulong __size;
  
  lVar3 = *pUser;
  __size = *(ulong *)((long)pUser + 8);
  uVar1 = lVar3 + len;
  if (__size < uVar1) {
    if (*(int *)((long)pUser + 0x18) == 0) {
      return 0;
    }
    do {
      __size = __size * 2;
      if (__size < 0x81) {
        __size = 0x80;
      }
    } while (__size < uVar1);
    pvVar2 = realloc(*(void **)((long)pUser + 0x10),__size);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    *(void **)((long)pUser + 0x10) = pvVar2;
    *(ulong *)((long)pUser + 8) = __size;
    lVar3 = *pUser;
  }
  else {
    pvVar2 = *(void **)((long)pUser + 0x10);
  }
  memcpy((void *)(lVar3 + (long)pvVar2),pBuf,(long)len);
  *(ulong *)pUser = uVar1;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void *pBuf, int len,
                                          void *pUser) {
  tdefl_output_buffer *p = (tdefl_output_buffer *)pUser;
  size_t new_size = p->m_size + len;
  if (new_size > p->m_capacity) {
    size_t new_capacity = p->m_capacity;
    mz_uint8 *pNew_buf;
    if (!p->m_expandable) return MZ_FALSE;
    do {
      new_capacity = MZ_MAX(128U, new_capacity << 1U);
    } while (new_size > new_capacity);
    pNew_buf = (mz_uint8 *)MZ_REALLOC(p->m_pBuf, new_capacity);
    if (!pNew_buf) return MZ_FALSE;
    p->m_pBuf = pNew_buf;
    p->m_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)p->m_pBuf + p->m_size, pBuf, len);
  p->m_size = new_size;
  return MZ_TRUE;
}